

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderBarrierTestCase::initTest(TessellationShaderBarrierTestCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TestError *this_00;
  char *tes_body;
  char *tcs_body;
  char *fs_body;
  int n_names;
  char **names;
  char *vs_body;
  long lVar5;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    (**(code **)(lVar5 + 0x708))(1,&this->m_vao_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0xa5);
    (**(code **)(lVar5 + 0xd8))(this->m_vao_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0xa8);
    iVar2 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])(this);
    (**(code **)(lVar5 + 0x6c8))(1,&this->m_bo_id);
    (**(code **)(lVar5 + 0x40))(0x8c8e,this->m_bo_id);
    (**(code **)(lVar5 + 0x48))(0x8c8e,0,this->m_bo_id);
    (**(code **)(lVar5 + 0x150))(0x8c8e,iVar2,0,0x88e4);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Could not set up storage for XFB data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0xb2);
    GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar4;
    GVar4 = (**(code **)(lVar5 + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
    this->m_tcs_id = GVar4;
    GVar4 = (**(code **)(lVar5 + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
    this->m_tes_id = GVar4;
    GVar4 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar4;
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Could not create shader objects",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0xba);
    fs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
    iVar2 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
    tcs_body = (char *)CONCAT44(extraout_var_00,iVar2);
    iVar2 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])(this);
    tes_body = (char *)CONCAT44(extraout_var_01,iVar2);
    iVar2 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])(this);
    vs_body = (char *)CONCAT44(extraout_var_02,iVar2);
    GVar4 = (**(code **)(lVar5 + 0x3c8))();
    this->m_po_id = GVar4;
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glCreateProgram() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0xcf);
    names = (char **)0x0;
    n_names = 0;
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
              (this,&n_names,&names);
    (**(code **)(lVar5 + 0x14c8))(this->m_po_id,n_names,names,0x8c8c);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glTransformFeedbackVaryings() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0xd8);
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&fs_body,
                       this->m_tcs_id,1,&tcs_body,this->m_tes_id,1,&tes_body,this->m_vs_id,1,
                       &vs_body,(bool *)0x0);
    if (!bVar1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Program linking failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                 ,0xde);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return;
}

Assistant:

void TessellationShaderBarrierTestCase::initTest()
{
	/* The test requires EXT_tessellation_shader */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Set up storage for XFB data. Also configure the BO binding points */
	const unsigned int xfb_data_size = getXFBBufferSize();

	gl.genBuffers(1, &m_bo_id);
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_data_size, NULL /* data */, GL_STATIC_DRAW);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up storage for XFB data");

	/* Set up shader objects */
	m_fs_id  = gl.createShader(GL_FRAGMENT_SHADER);
	m_tcs_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	m_tes_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	m_vs_id  = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader objects");

	/* Set up fragment shader body */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	/* Set up tessellation control shader body */
	const char* tcs_body = getTCSCode();

	/* Set up tessellation evaluation shader body */
	const char* tes_body = getTESCode();

	/* Set up vertex shader body */
	const char* vs_body = getVSCode();

	/* Set up a program object */
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Set up XFB */
	const char** names   = NULL;
	int			 n_names = 0;

	getXFBProperties(&n_names, &names);

	gl.transformFeedbackVaryings(m_po_id, n_names, names, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed");

	/* Try to compile and link all the shader objects */
	if (!buildProgram(m_po_id, m_fs_id, 1, &fs_body, m_tcs_id, 1, &tcs_body, m_tes_id, 1, &tes_body, m_vs_id, 1,
					  &vs_body))
	{
		TCU_FAIL("Program linking failed");
	}

	/* All set! */
}